

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl3.h
# Opt level: O0

void nk_glfw3_mouse_button_callback(GLFWwindow *win,int button,int action,int mods)

{
  GLFWwindow *handle;
  int in_EDX;
  int in_ESI;
  double dVar1;
  nk_vec2 nVar2;
  double dt;
  nk_glfw *glfw;
  double y;
  double x;
  GLFWwindow *in_stack_ffffffffffffffb8;
  double *in_stack_ffffffffffffffc0;
  double *in_stack_ffffffffffffffc8;
  GLFWwindow *pGVar3;
  double local_28;
  double local_20;
  
  if (in_ESI == 0) {
    handle = (GLFWwindow *)glfwGetWindowUserPointer(in_stack_ffffffffffffffb8);
    glfwGetCursorPos(handle,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (in_EDX == 1) {
      dVar1 = glfwGetTime();
      pGVar3 = handle;
      if ((0.02 < dVar1 - *(double *)(handle + 0x4768)) &&
         (dVar1 - *(double *)(handle + 0x4768) < 0.2)) {
        *(undefined4 *)(handle + 0x4770) = 1;
        nVar2 = nk_vec2((float)local_20,(float)local_28);
        *(nk_vec2 *)(handle + 0x4774) = nVar2;
      }
      dVar1 = glfwGetTime();
      *(double *)(pGVar3 + 0x4768) = dVar1;
    }
    else {
      *(undefined4 *)(handle + 0x4770) = 0;
    }
  }
  return;
}

Assistant:

NK_API void
nk_glfw3_mouse_button_callback(GLFWwindow* win, int button, int action, int mods)
{
    double x, y;
    if (button != GLFW_MOUSE_BUTTON_LEFT) return;
    struct nk_glfw* glfw = glfwGetWindowUserPointer(win);
    glfwGetCursorPos(win, &x, &y);
    if (action == GLFW_PRESS)  {
        double dt = glfwGetTime() - glfw->last_button_click;
        if (dt > NK_GLFW_DOUBLE_CLICK_LO && dt < NK_GLFW_DOUBLE_CLICK_HI) {
            glfw->is_double_click_down = nk_true;
            glfw->double_click_pos = nk_vec2((float)x, (float)y);
        }
        glfw->last_button_click = glfwGetTime();
    } else glfw->is_double_click_down = nk_false;
}